

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_BinTree.h
# Opt level: O2

Iterator __thiscall
axl::sl::
BinTreeBase<axl::sl::RbTree<unsigned_long,_axl::spy::ThreadState::Frame,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_const_axl::spy::ThreadState::Frame_&>,_axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_const_axl::spy::ThreadState::Frame_&>
::find(BinTreeBase<axl::sl::RbTree<unsigned_long,_axl::spy::ThreadState::Frame,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_const_axl::spy::ThreadState::Frame_&>,_axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_const_axl::spy::ThreadState::Frame_&>
       *this,unsigned_long key)

{
  IteratorBase<axl::sl::Iterator<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ListLink>_>,_axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ListLink>_>
  IVar1;
  ulong uVar2;
  RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame> **ppRVar3;
  
  ppRVar3 = &this->m_root;
  while( true ) {
    IVar1.m_p = *ppRVar3;
    if ((IVar1.m_p == (Entry *)0x0) ||
       (uVar2 = *(ulong *)((long)&(IVar1.m_p)->
                                  super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
                          + 0x10), uVar2 == key)) break;
    ppRVar3 = (RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame> **)
              ((long)&(IVar1.m_p)->
                      super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
              + (ulong)(uVar2 <= key) * 8 + 0x48);
  }
  return (Iterator)IVar1.m_p;
}

Assistant:

Iterator
	find(KeyArg key) {
		Node* node = m_root;

		while (node) {
			int cmp = m_cmp(key, node->m_key);
			if (cmp == 0)
				return node;

			node = cmp < 0 ? node->m_left : node->m_right;
		}

		return NULL;
	}